

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O3

Value<char16_t> * __thiscall
Qentem::HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
          (HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *this,Char_T *key,SizeT length
          )

{
  Char_T *pCVar1;
  SizeT *pSVar2;
  long lVar3;
  int iVar4;
  SizeT SVar5;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *pHVar6;
  char16_t *to;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  SizeT SVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  Value<char16_t> *pVVar15;
  SizeT *index;
  SizeT *local_48;
  String<char16_t> local_40;
  
  SVar11 = (this->
           super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
           ).index_;
  if (SVar11 == (this->
                super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                ).capacity_) {
    HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
    ::resize(&this->
              super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
             ,(SVar11 + (SVar11 == 0)) * 2);
  }
  if (length == 0) {
    SVar11 = 0x8000000b;
  }
  else {
    uVar10 = 0xb;
    iVar4 = 0;
    uVar9 = 0;
    uVar7 = (ulong)length;
    iVar12 = 0x21;
    do {
      pCVar1 = key + uVar9;
      iVar14 = iVar4 + iVar12;
      uVar8 = (uint)uVar9;
      iVar4 = iVar4 + 2;
      uVar13 = (uint)uVar7;
      uVar9 = uVar9 + 1;
      lVar3 = uVar7 - 1;
      uVar7 = uVar7 - 1;
      uVar10 = (uint)(ushort)key[lVar3] +
               (uVar13 ^ uVar8) * ((uint)(ushort)*pCVar1 * iVar12 * uVar8 + uVar10);
      iVar12 = iVar14;
    } while (uVar9 < uVar7);
    SVar11 = uVar10 | 0x80000000;
  }
  pHVar6 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
           ::find(&this->
                   super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                  ,&local_48,key,length,SVar11);
  if (pHVar6 == (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)0x0) {
    local_40.storage_ = (char16_t *)0x0;
    local_40.length_ = 0;
    to = String<char16_t>::allocate(&local_40,length + 1);
    Memory::Copy<unsigned_int>(to,key,length * 2);
    to[length] = L'\0';
    uVar10 = (this->
             super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
             ).capacity_;
    uVar8 = (this->
            super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
            ).index_;
    pSVar2 = (this->
             super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
             ).hashTable_;
    SVar5 = uVar8 + 1;
    (this->
    super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
    ).index_ = SVar5;
    *local_48 = SVar5;
    pVVar15 = (Value<char16_t> *)(pSVar2 + (ulong)uVar10 + (ulong)uVar8 * 0xc + 6);
    ((HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)(pVVar15 + -1))->Hash = SVar11;
    ((HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)(pVVar15 + -1))->Next = 0;
    (((HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)(pVVar15 + -1))->Key).storage_
         = local_40.storage_;
    (((HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)(pVVar15 + -1))->Key).length_
         = length;
    local_40.length_ = 0;
    local_40.storage_ = (char16_t *)0x0;
    operator_delete((void *)0x0);
    pVVar15->type_ = Undefined;
    (pVVar15->field_0).array_.storage_ = (Value<char16_t> *)0x0;
    *(SizeT *)((long)&pVVar15->field_0 + 8) = 0;
    *(SizeT *)((long)&pVVar15->field_0 + 0xc) = 0;
  }
  else {
    pVVar15 = &pHVar6->Value;
  }
  return pVVar15;
}

Assistant:

Value_T &Get(const Char_T *key, const SizeT length) {
        if (Size() == Capacity()) {
            expand();
        }

        const SizeT hash = StringUtils::Hash(key, length);
        SizeT      *index;
        HItem      *item = find(index, key, length, hash);

        if (item != nullptr) {
            return item->Value;
        }

        item = insert(index, Key_T{key, length}, hash);
        Memory::Initialize(&(item->Value));

        return item->Value;
    }